

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int build_huffman(huffman *h,int *count)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int m;
  int c;
  int s;
  int code;
  int k;
  int j;
  int i;
  int *count_local;
  huffman *h_local;
  
  s = 0;
  for (k = 0; k < 0x10; k = k + 1) {
    for (code = 0; code < count[k]; code = code + 1) {
      h->size[s] = (char)k + '\x01';
      s = s + 1;
    }
  }
  h->size[s] = '\0';
  c = 0;
  s = 0;
  code = 1;
  do {
    if (0x10 < code) {
      h->maxcode[code] = 0xffffffff;
      memset(h,0xff,0x200);
      for (k = 0; k < s; k = k + 1) {
        bVar1 = h->size[k];
        if (bVar1 < 10) {
          uVar2 = h->code[k];
          for (code = 0; code < 1 << (9 - bVar1 & 0x1f); code = code + 1) {
            h->fast[(int)(((uint)uVar2 << (9 - bVar1 & 0x1f)) + code)] = (uint8)k;
          }
        }
      }
      return 1;
    }
    h->delta[code] = s - c;
    if ((uint)h->size[s] == code) {
      while ((uint)h->size[s] == code) {
        h->code[s] = (uint16)c;
        c = c + 1;
        s = s + 1;
      }
      if (1 << ((byte)code & 0x1f) <= c + -1) {
        iVar3 = e("Corrupt JPEG");
        return iVar3;
      }
    }
    h->maxcode[code] = c << (0x10 - (byte)code & 0x1f);
    c = c << 1;
    code = code + 1;
  } while( true );
}

Assistant:

static int build_huffman(huffman *h, int *count)
{
   int i,j,k=0,code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i)
      for (j=0; j < count[i]; ++j)
         h->size[k++] = (uint8) (i+1);
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (uint16) (code++);
         if (code-1 >= (1 << j)) return e("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (uint8) i;
         }
      }
   }
   return 1;
}